

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O3

size_t unescape(char *out,char *in,size_t len)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  
  pbVar2 = (byte *)out;
  if (len != 0) {
    uVar4 = 0;
    do {
      bVar1 = in[uVar4];
      uVar3 = uVar4;
      if (bVar1 == 0x5c) {
        uVar3 = uVar4 + 1;
        bVar1 = in[uVar4 + 1];
        if (bVar1 < 0x66) {
          if ((bVar1 != 0x22) && (bVar1 != 0x5c)) {
            if (bVar1 != 0x62) goto LAB_00106d35;
            bVar1 = 8;
          }
        }
        else if (bVar1 < 0x72) {
          if (bVar1 == 0x66) {
            bVar1 = 0xc;
          }
          else if (bVar1 == 0x6e) {
            bVar1 = 10;
          }
          else {
LAB_00106d35:
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                    ,0xce,"Unsupported escape sequence \\%c\n",(ulong)(uint)(int)(char)bVar1);
            bVar1 = 0x5c;
            uVar3 = uVar4;
          }
        }
        else if (bVar1 == 0x72) {
          bVar1 = 0xd;
        }
        else {
          if (bVar1 != 0x74) goto LAB_00106d35;
          bVar1 = 9;
        }
      }
      *pbVar2 = bVar1;
      pbVar2 = pbVar2 + 1;
      uVar4 = uVar3 + 1;
    } while (uVar4 < len);
  }
  *pbVar2 = 0;
  return (long)pbVar2 - (long)out;
}

Assistant:

size_t
unescape(char *out, const char *in, size_t len)
{
   char *ptr = out;
   size_t i;

   for (i = 0; i < len; ++i) {
      int c = in[i];
      if (c == '\\') {
          switch (in[i+1]) {
          case '"':  *ptr++ = '"'; i++; break;
          case '\\': *ptr++ = '\\'; i++; break;
          case 'b':  *ptr++ = '\b'; i++; break;
          case 'f':  *ptr++ = '\f'; i++; break;
          case 'n': *ptr++ = '\n'; i++; break;
          case 'r': *ptr++ = '\r'; i++; break;
          case 't': *ptr++ = '\t'; i++; break;
          default:
              E_WARN("Unsupported escape sequence \\%c\n", in[i+1]);
              *ptr++ = c;
          }
      }
      else {
          *ptr++ = c;
      }
   }
   *ptr = '\0';
   return ptr - out;
}